

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  char *oend;
  uint uVar1;
  void *pvVar2;
  ZSTD_freeFunction p_Var3;
  ZSTD_allocFunction p_Var4;
  bool bVar5;
  BYTE *src;
  ZSTD_nextInputType_e ZVar6;
  ZSTD_DDict *pZVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  void *__src;
  ulong uVar16;
  void *pvVar17;
  bool bVar18;
  char *op;
  ZSTD_frameHeader *local_98;
  BYTE *local_90;
  size_t *local_88;
  void *local_80;
  ZSTD_outBuffer *local_78;
  void *local_70;
  ZSTD_inBuffer *local_68;
  ZSTD_outBuffer *local_60;
  char *local_58;
  size_t local_50;
  ZSTD_frameSizeInfo frameSizeInfo;
  
  local_70 = input->src;
  uVar15 = input->size;
  uVar13 = input->pos;
  pvVar2 = output->dst;
  uVar16 = output->size;
  uVar14 = output->pos;
  op = (char *)((long)pvVar2 + uVar14);
  sVar12 = 0xffffffffffffffb8;
  local_50 = uVar15 - uVar13;
  if (uVar13 <= uVar15) {
    if (uVar16 < uVar14) {
LAB_002169a9:
      sVar12 = 0xffffffffffffffba;
    }
    else {
      if ((zds->outBufferMode == ZSTD_bm_stable) && (zds->streamStage != zdss_init)) {
        sVar12 = 0xffffffffffffff98;
        if ((zds->expectedOutBuffer).size == uVar16 &&
            (uVar14 == (zds->expectedOutBuffer).pos && (zds->expectedOutBuffer).dst == pvVar2)) {
          sVar12 = 0;
        }
      }
      else {
        sVar12 = 0;
      }
      if (sVar12 < 0xffffffffffffff89) {
        __src = (void *)(uVar13 + (long)local_70);
        pvVar17 = (void *)(uVar15 + (long)local_70);
        oend = (char *)((long)pvVar2 + uVar16);
        local_78 = &zds->expectedOutBuffer;
        local_88 = &zds->outStart;
        local_98 = &zds->fParams;
        local_90 = zds->headerBuffer;
        local_80 = __src;
        local_68 = input;
        local_60 = output;
        local_58 = op;
LAB_00216a57:
        pcVar8 = op;
        bVar5 = true;
        switch(zds->streamStage) {
        case zdss_init:
          goto switchD_00216a7b_caseD_0;
        case zdss_loadHeader:
          goto switchD_00216a7b_caseD_1;
        case zdss_read:
          goto switchD_00216a7b_caseD_2;
        case zdss_load:
          goto switchD_00216a7b_caseD_3;
        case zdss_flush:
          uVar13 = zds->outEnd - zds->outStart;
          uVar16 = (long)oend - (long)op;
          uVar15 = uVar13;
          if (uVar16 < uVar13) {
            uVar15 = uVar16;
          }
          if (uVar15 != 0) {
            memcpy(op,zds->outBuff + zds->outStart,uVar15);
          }
          op = pcVar8 + uVar15;
          if (pcVar8 == (char *)0x0) {
            op = pcVar8;
          }
          sVar10 = *local_88;
          *local_88 = uVar15 + sVar10;
          if (uVar13 <= uVar16) {
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < uVar15 + sVar10 + (ulong)(zds->fParams).blockSizeMax)) {
              *local_88 = 0;
              local_88[1] = 0;
            }
          }
          bVar5 = uVar13 <= uVar16;
          goto LAB_002171fc;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x8f2,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
      }
    }
  }
  return sVar12;
switchD_00216a7b_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->inPos = 0;
  *(undefined8 *)((long)local_88 + 0xc) = 0;
  *(undefined8 *)((long)local_88 + 0x14) = 0;
  *local_88 = 0;
  local_88[1] = 0;
  local_78->pos = local_60->pos;
  sVar10 = local_60->size;
  local_78->dst = local_60->dst;
  local_78->size = sVar10;
switchD_00216a7b_caseD_1:
  sVar10 = ZSTD_getFrameHeader_advanced(local_98,local_90,zds->lhSize,zds->format);
  if ((zds->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
     (zds->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
    ZSTD_DCtx_selectFrameDDict(zds);
  }
  src = local_90;
  if (sVar10 < 0xffffffffffffff89) {
    if (sVar10 == 0) {
      iVar11 = 0;
    }
    else {
      uVar15 = (long)pvVar17 - (long)__src;
      if (pvVar17 < __src) {
        __assert_fail("iend >= ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x842,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
      sVar9 = zds->lhSize;
      uVar13 = sVar10 - sVar9;
      if (uVar15 < uVar13) {
        if (pvVar17 != __src) {
          memcpy(local_90 + sVar9,__src,uVar15);
          zds->lhSize = zds->lhSize + uVar15;
        }
        local_68->pos = local_68->size;
        sVar12 = ZSTD_getFrameHeader_advanced(local_98,src,zds->lhSize,zds->format);
        if (sVar12 < 0xffffffffffffff89) {
          uVar15 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
          if (sVar10 < uVar15) {
            sVar10 = uVar15;
          }
          sVar12 = (sVar10 - zds->lhSize) + 3;
        }
        iVar11 = 1;
      }
      else {
        if (__src == (void *)0x0) {
          __assert_fail("ip != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x850,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        memcpy(local_90 + sVar9,__src,uVar13);
        zds->lhSize = sVar10;
        __src = (void *)((long)__src + uVar13);
        iVar11 = 6;
      }
    }
  }
  else {
    iVar11 = 1;
    sVar12 = sVar10;
  }
  sVar10 = local_50;
  pvVar2 = local_80;
  pcVar8 = op;
  bVar18 = true;
  bVar5 = true;
  if (iVar11 != 6) {
    if (iVar11 != 0) {
      return sVar12;
    }
    bVar5 = bVar18;
    if (((local_98->frameContentSize != 0xffffffffffffffff) &&
        ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
       (uVar15 = (long)oend - (long)op, local_98->frameContentSize <= uVar15)) {
      ZSTD_findFrameSizeInfo(&frameSizeInfo,local_80,local_50);
      sVar9 = frameSizeInfo.compressedSize;
      if (sVar10 < frameSizeInfo.compressedSize) {
        iVar11 = 0;
        sVar10 = sVar12;
LAB_00216dbd:
        bVar5 = true;
        sVar12 = sVar10;
      }
      else {
        pZVar7 = ZSTD_getDDict(zds);
        sVar10 = ZSTD_decompressMultiFrame(zds,pcVar8,uVar15,pvVar2,sVar9,(void *)0x0,0,pZVar7);
        if (0xffffffffffffff88 < sVar10) {
          iVar11 = 1;
          goto LAB_00216dbd;
        }
        if (local_70 == (void *)0x0) {
          __assert_fail("istart != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x85f,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        __src = (void *)(sVar9 + (long)pvVar2);
        op = pcVar8 + sVar10;
        if (pcVar8 == (char *)0x0) {
          op = pcVar8;
        }
        zds->expected = 0;
        zds->streamStage = zdss_init;
        bVar5 = false;
        iVar11 = 6;
      }
      if (iVar11 == 6) goto LAB_002171fc;
      if (iVar11 != 0) {
        return sVar12;
      }
    }
    if (((zds->outBufferMode == ZSTD_bm_stable) && ((zds->fParams).frameType != ZSTD_skippableFrame)
        ) && ((local_98->frameContentSize != 0xffffffffffffffff &&
              ((ulong)((long)oend - (long)op) < local_98->frameContentSize)))) goto LAB_002169a9;
    pZVar7 = ZSTD_getDDict(zds);
    ZSTD_decompressBegin_usingDDict(zds,pZVar7);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      zds->expected = (ulong)*(uint *)(zds->headerBuffer + 4);
      zds->stage = ZSTDds_skipFrame;
    }
    else {
      sVar10 = ZSTD_decodeFrameHeader(zds,local_90,zds->lhSize);
      if (0xffffffffffffff88 < sVar10) {
        return sVar10;
      }
      zds->expected = 3;
      zds->stage = ZSTDds_decodeBlockHeader;
    }
    uVar15 = (zds->fParams).windowSize;
    if (uVar15 < 0x401) {
      uVar15 = 0x400;
    }
    (zds->fParams).windowSize = uVar15;
    if (zds->maxWindowSize < uVar15) {
      return 0xfffffffffffffff0;
    }
    uVar1 = (zds->fParams).blockSizeMax;
    if (uVar1 < 5) {
      uVar1 = 4;
    }
    uVar13 = (ulong)uVar1;
    if (zds->outBufferMode == ZSTD_bm_buffered) {
      uVar16 = 0x20000;
      if (uVar15 < 0x20000) {
        uVar16 = uVar15;
      }
      uVar16 = uVar15 + uVar16 + 0x20040;
      uVar15 = local_98->frameContentSize;
      if (uVar16 < local_98->frameContentSize) {
        uVar15 = uVar16;
      }
    }
    else {
      uVar15 = 0;
    }
    uVar16 = uVar13 + uVar15;
    if (zds->outBuffSize + zds->inBuffSize < uVar16 * 3) {
      zds->oversizedDuration = 0;
    }
    else {
      zds->oversizedDuration = zds->oversizedDuration + 1;
    }
    if (((zds->inBuffSize < uVar13) || (zds->outBuffSize < uVar15)) ||
       (0x7f < zds->oversizedDuration)) {
      uVar14 = zds->staticSize;
      if (uVar14 == 0) {
        pcVar8 = zds->inBuff;
        if (pcVar8 != (char *)0x0) {
          p_Var3 = (zds->customMem).customFree;
          if (p_Var3 == (ZSTD_freeFunction)0x0) {
            free(pcVar8);
          }
          else {
            (*p_Var3)((zds->customMem).opaque,pcVar8);
          }
        }
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        p_Var4 = (zds->customMem).customAlloc;
        if (p_Var4 == (ZSTD_allocFunction)0x0) {
          pcVar8 = (char *)malloc(uVar16);
        }
        else {
          pcVar8 = (char *)(*p_Var4)((zds->customMem).opaque,uVar16);
        }
        zds->inBuff = pcVar8;
        if (pcVar8 != (char *)0x0) goto LAB_00216fe6;
      }
      else {
        if (uVar14 < 0x176e0) {
          __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x898,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        if (uVar16 <= uVar14 - 0x176e0) {
LAB_00216fe6:
          zds->inBuffSize = uVar13;
          zds->outBuff = zds->inBuff + uVar13;
          zds->outBuffSize = uVar15;
          goto LAB_00217002;
        }
      }
      sVar12 = 0xffffffffffffffc0;
      bVar18 = false;
    }
    else {
LAB_00217002:
      bVar18 = true;
    }
    if (!bVar18) {
      return sVar12;
    }
    zds->streamStage = zdss_read;
switchD_00216a7b_caseD_2:
    uVar15 = (long)pvVar17 - (long)__src;
    if ((zds->stage - ZSTDds_decompressBlock < 2) && (zds->bType == bt_raw)) {
      uVar13 = zds->expected;
      if (uVar15 <= zds->expected) {
        uVar13 = uVar15;
      }
      sVar10 = uVar13 + (uVar13 == 0);
    }
    else {
      sVar10 = zds->expected;
    }
    if (sVar10 == 0) {
      zds->streamStage = zdss_init;
      bVar5 = false;
LAB_00217095:
      iVar11 = 6;
      sVar9 = sVar12;
    }
    else {
      iVar11 = 0;
      sVar9 = sVar12;
      if (sVar10 <= uVar15) {
        sVar9 = ZSTD_decompressContinueStream(zds,&op,oend,__src,sVar10);
        iVar11 = 1;
        if (sVar9 < 0xffffffffffffff89) {
          if (__src == (void *)0x0) {
            __assert_fail("ip != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x8b5,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          __src = (void *)((long)__src + sVar10);
          goto LAB_00217095;
        }
      }
    }
    sVar12 = sVar9;
    if (iVar11 != 6) {
      if (iVar11 != 0) {
        return sVar12;
      }
      if (__src == pvVar17) {
        bVar5 = false;
      }
      else {
        zds->streamStage = zdss_load;
switchD_00216a7b_caseD_3:
        uVar15 = zds->expected;
        uVar16 = (long)pvVar17 - (long)__src;
        uVar13 = uVar15;
        if ((zds->stage - ZSTDds_decompressBlock < 2) && (zds->bType == bt_raw)) {
          if (uVar16 <= uVar15) {
            uVar13 = uVar16;
          }
          uVar13 = uVar13 + (uVar13 == 0);
        }
        if (uVar15 != uVar13) {
          __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x8c4,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        sVar10 = zds->inPos;
        uVar14 = uVar15 - sVar10;
        uVar13 = uVar14;
        if (zds->stage == ZSTDds_skipFrame) {
          if (uVar16 <= uVar14) {
            uVar13 = uVar16;
          }
LAB_00217193:
          if (uVar13 != 0) {
            __src = (void *)((long)__src + uVar13);
            zds->inPos = zds->inPos + uVar13;
          }
          if (uVar13 < uVar14) {
            bVar5 = false;
            bVar18 = true;
          }
          else {
            zds->inPos = 0;
            sVar10 = ZSTD_decompressContinueStream(zds,&op,oend,zds->inBuff,uVar15);
            bVar18 = sVar10 < 0xffffffffffffff89;
            if (!bVar18) {
              sVar12 = sVar10;
            }
          }
        }
        else {
          if (uVar14 <= zds->inBuffSize - sVar10) {
            if (uVar16 <= uVar14) {
              uVar13 = uVar16;
            }
            if (uVar13 != 0) {
              memcpy(zds->inBuff + sVar10,__src,uVar13);
            }
            goto LAB_00217193;
          }
          bVar18 = false;
          sVar12 = 0xffffffffffffffec;
        }
        if (!bVar18) {
          return sVar12;
        }
      }
    }
  }
LAB_002171fc:
  if (!bVar5) {
    local_68->pos = (long)__src - (long)local_68->src;
    sVar12 = (long)op - (long)local_60->dst;
    local_60->pos = sVar12;
    local_78->pos = sVar12;
    sVar12 = local_60->size;
    local_78->dst = local_60->dst;
    local_78->size = sVar12;
    if (local_58 == op && local_80 == __src) {
      iVar11 = zds->noForwardProgress;
      zds->noForwardProgress = iVar11 + 1;
      if (0xe < iVar11) {
        if (op == oend) {
          return 0xffffffffffffffb0;
        }
        if (__src == pvVar17) {
          return 0xffffffffffffffae;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x902,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    sVar12 = zds->expected;
    if (sVar12 == 0) {
      if (zds->outEnd != zds->outStart) {
        if (zds->hostageByte != 0) {
          return 1;
        }
        local_68->pos = local_68->pos - 1;
        zds->hostageByte = 1;
        return 1;
      }
      if (zds->hostageByte != 0) {
        if (local_68->size <= local_68->pos) {
          zds->streamStage = zdss_read;
          return 1;
        }
        local_68->pos = local_68->pos + 1;
      }
      return 0;
    }
    ZVar6 = ZSTD_nextInputType(zds);
    uVar15 = (ulong)(ZVar6 == ZSTDnit_block) * 3 + sVar12;
    if (zds->inPos <= uVar15) {
      return uVar15 - zds->inPos;
    }
    __assert_fail("zds->inPos <= nextSrcSizeHint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x91b,
                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)")
    ;
  }
  goto LAB_00216a57;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            zds->legacyVersion = 0;
#endif
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            ZSTD_FALLTHROUGH;

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        /* check first few bytes */
                        FORWARD_IF_ERROR(
                            ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format),
                            "First few bytes detected incorrect" );
                        /* return hint input size */
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    assert(istart != NULL);
                    ip = istart + cSize;
                    op = op ? op + decompressedSize : op; /* can occur if frameContentSize = 0 (empty frame) */
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            ZSTD_FALLTHROUGH;

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    assert(ip != NULL);
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            ZSTD_FALLTHROUGH;

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip)));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                if (loadedSize != 0) {
                    /* ip may be NULL */
                    ip += loadedSize;
                    zds->inPos += loadedSize;
                }
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {
                size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);

                op = op ? op + flushedSize : op;

                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                        && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, noForwardProgress_destFull, "");
            RETURN_ERROR_IF(ip==iend, noForwardProgress_inputEmpty, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}